

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase434::run(TestCase434 *this)

{
  PromiseNode *pPVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  TransformPromiseNodeBase *this_00;
  nfds_t __nfds;
  nfds_t __nfds_00;
  UnixEventPort *this_01;
  pollfd *ppVar5;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar6;
  bool writable;
  Fault f_1;
  AutoCloseFd outfd;
  Fault f_2;
  AutoCloseFd infd;
  int pipefds [2];
  EventLoop loop;
  FdObserver observer;
  UnixEventPort port;
  char buffer [4096];
  char local_11e9;
  Own<kj::_::PromiseNode> local_11e8;
  AutoCloseFd local_11d0;
  undefined1 local_11c8 [8];
  PromiseNode *local_11c0;
  AutoCloseFd local_11b8;
  int local_11b0;
  int local_11ac;
  EventLoop local_11a8;
  FdObserver local_1170;
  UnixEventPort local_1118;
  undefined8 *local_1038;
  long *plStack_1030;
  
  captureSignals();
  this_01 = &local_1118;
  UnixEventPort::UnixEventPort(this_01);
  EventLoop::EventLoop(&local_11a8,&this_01->super_EventPort);
  EventLoop::enterScope(&local_11a8);
  do {
    iVar2 = ::pipe(&local_11b0);
    if (-1 < iVar2) {
      iVar2 = 0;
      break;
    }
    uVar3 = _::Debug::getOsErrorNumber(false);
    this_01 = (UnixEventPort *)((ulong)this_01 & 0xffffffff);
    if (uVar3 != 0xffffffff) {
      this_01 = (UnixEventPort *)(ulong)uVar3;
    }
    iVar2 = (int)this_01;
  } while (uVar3 == 0xffffffff);
  if (iVar2 != 0) {
    local_1170.eventPort = (UnixEventPort *)0x0;
    local_1038 = (undefined8 *)0x0;
    plStack_1030 = (long *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_1170,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_1170);
  }
  local_11b8.fd = local_11b0;
  UnwindDetector::UnwindDetector(&local_11b8.unwindDetector);
  local_11d0.fd = local_11ac;
  UnwindDetector::UnwindDetector(&local_11d0.unwindDetector);
  setNonblocking(local_11d0.fd);
  setNonblocking(local_11b8.fd);
  UnixEventPort::FdObserver::FdObserver(&local_1170,&local_1118,local_11d0.fd,2);
LAB_001e2116:
  do {
    sVar4 = ::write(local_11d0.fd,"foo",3);
    iVar2 = 0;
    if (sVar4 < 0) {
      iVar2 = _::Debug::getOsErrorNumber(true);
      if (iVar2 == -1) goto LAB_001e2116;
    }
    if (iVar2 != 0) {
      local_11e8.disposer = (Disposer *)0x0;
      local_1038 = (undefined8 *)0x0;
      plStack_1030 = (long *)0x0;
      _::Debug::Fault::init
                ((Fault *)&local_11e8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      _::Debug::Fault::fatal((Fault *)&local_11e8);
    }
  } while (-1 < sVar4);
  local_11e9 = '\0';
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_11c8);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)local_11c8,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++:456:13),_kj::_::PropagateException>
             ::anon_class_8_1_79db791e_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004550a0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_11e9;
  local_11e8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase434::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_11e8.ptr = (PromiseNode *)this_00;
  OVar6 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_1038,&local_11e8);
  pPVar1 = local_11e8.ptr;
  if ((TransformPromiseNodeBase *)local_11e8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_11e8.ptr = (PromiseNode *)0x0;
    (**(local_11e8.disposer)->_vptr_Disposer)
              (local_11e8.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar6.ptr);
  }
  pPVar1 = local_11c0;
  if (local_11c0 != (PromiseNode *)0x0) {
    local_11c0 = (PromiseNode *)0x0;
    (**(_func_int **)(((String *)local_11c8)->content).ptr)
              (local_11c8,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  ppVar5 = (pollfd *)0xffffffff;
  EventLoop::run(&local_11a8,0xffffffff);
  UnixEventPort::poll(&local_1118,ppVar5,__nfds,iVar2);
  EventLoop::run(&local_11a8,0xffffffff);
  if ((local_11e9 == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x1ce,ERROR,"\"failed: expected \" \"!(writable)\"",
               (char (*) [29])"failed: expected !(writable)");
  }
LAB_001e2281:
  do {
    sVar4 = read(local_11b8.fd,&local_1038,0x1000);
    iVar2 = 0;
    if (sVar4 < 0) {
      iVar2 = _::Debug::getOsErrorNumber(true);
      if (iVar2 == -1) goto LAB_001e2281;
    }
    if (iVar2 != 0) {
      local_11c8 = (undefined1  [8])0x0;
      local_11e8.disposer = (Disposer *)0x0;
      local_11e8.ptr = (PromiseNode *)0x0;
      _::Debug::Fault::init
                ((Fault *)local_11c8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      _::Debug::Fault::fatal((Fault *)local_11c8);
    }
    if (sVar4 < 1) {
      ppVar5 = (pollfd *)0xffffffff;
      EventLoop::run(&local_11a8,0xffffffff);
      UnixEventPort::poll(&local_1118,ppVar5,__nfds_00,iVar2);
      EventLoop::run(&local_11a8,0xffffffff);
      if ((local_11e9 == '\0') && (_::Debug::minSeverity < 3)) {
        _::Debug::log<char_const(&)[26]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x1dd,ERROR,"\"failed: expected \" \"writable\"",
                   (char (*) [26])"failed: expected writable");
      }
      if (plStack_1030 != (long *)0x0) {
        (**(code **)*local_1038)(local_1038,(long)plStack_1030 + *(long *)(*plStack_1030 + -0x10));
      }
      UnixEventPort::FdObserver::~FdObserver(&local_1170);
      AutoCloseFd::~AutoCloseFd(&local_11d0);
      AutoCloseFd::~AutoCloseFd(&local_11b8);
      EventLoop::leaveScope(&local_11a8);
      EventLoop::~EventLoop(&local_11a8);
      UnixEventPort::~UnixEventPort(&local_1118);
      return;
    }
  } while( true );
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2];
  KJ_SYSCALL(pipe(pipefds));
  kj::AutoCloseFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096];
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}